

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_sig(uchar **p,uchar *end,mbedtls_x509_buf *sig)

{
  byte bVar1;
  int iVar2;
  size_t sStack_38;
  int tag_type;
  size_t len;
  mbedtls_x509_buf *pmStack_28;
  int ret;
  mbedtls_x509_buf *sig_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    p_local._4_4_ = -0x24e0;
  }
  else {
    bVar1 = **p;
    pmStack_28 = sig;
    sig_local = (mbedtls_x509_buf *)end;
    end_local = (uchar *)p;
    iVar2 = mbedtls_asn1_get_bitstring_null(p,end,&stack0xffffffffffffffc8);
    if (iVar2 == 0) {
      pmStack_28->tag = (uint)bVar1;
      pmStack_28->len = sStack_38;
      pmStack_28->p = *(uchar **)end_local;
      *(size_t *)end_local = sStack_38 + *(long *)end_local;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = iVar2 + -0x2480;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_sig( unsigned char **p, const unsigned char *end, mbedtls_x509_buf *sig )
{
    int ret;
    size_t len;
    int tag_type;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_SIGNATURE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag_type = **p;

    if( ( ret = mbedtls_asn1_get_bitstring_null( p, end, &len ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_SIGNATURE + ret );

    sig->tag = tag_type;
    sig->len = len;
    sig->p = *p;

    *p += len;

    return( 0 );
}